

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O3

int checkBooleanOption(char *option)

{
  char **ppcVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  
  ppcVar1 = booleanOptionTags;
  lVar4 = 0;
  do {
    iVar2 = strcmp(ppcVar1[lVar4],option + 1);
    iVar5 = 1;
    if (iVar2 == 0) goto LAB_0010191d;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  sVar3 = strlen(option);
  if (((3 < sVar3) && (option[1] == 'n')) && (option[2] == 'o')) {
    iVar5 = 0;
    lVar4 = 0;
    do {
      iVar2 = strcmp(ppcVar1[lVar4],option + 3);
      if (iVar2 == 0) {
LAB_0010191d:
        booleanOptions[lVar4] = iVar5;
        return 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
  }
  return 0;
}

Assistant:

int checkBooleanOption (char *option)
{
    int o;

    for (o=0;o<MAX_BOOLEAN_OPTIONS;o++)
    {
        if (strcmp (booleanOptionTags[o], &option[1]) == 0)
        {
            booleanOptions[o] = 1;
            return 1;
        }
    }

    if (strlen (option) > 3 && option[1] == 'n' && option[2] == 'o')
        for (o=0;o<MAX_BOOLEAN_OPTIONS;o++)
        {
            if (strcmp (booleanOptionTags[o], &option[3]) == 0)
            {
                booleanOptions[o] = 0;
                return 1;
            }
        }
    return 0;
}